

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

void load_impl_library(void)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  ulong __size;
  
  pcVar1 = getenv("WPE_BACKEND_LIBRARY");
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
    s_impl_library = (void *)dlopen(pcVar1,2);
    if (s_impl_library == (void *)0x0) {
      load_impl_library_cold_1();
      goto LAB_00105dee;
    }
    wpe_loader_set_impl_library_name(pcVar1);
  }
  if (s_impl_library == (void *)0x0) {
    __s = "libWPEBackend-default.so";
    s_impl_library = (void *)dlopen("libWPEBackend-default.so",2);
    if (s_impl_library == (void *)0x0) {
LAB_00105dee:
      load_impl_library_cold_2();
      if (__s != (char *)0x0) {
        sVar2 = strlen(__s);
        if (sVar2 != 0) {
          __size = sVar2 + 1;
          if (__size < 0x201) {
            pcVar1 = s_impl_library_name_buffer;
          }
          else {
            pcVar1 = (char *)malloc(__size);
            if (pcVar1 == (char *)0x0) {
              wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/loader.c"
                             ,0x3a,__size);
            }
          }
          s_impl_library_name = pcVar1;
          memcpy(pcVar1,__s,__size);
          return;
        }
      }
      return;
    }
    wpe_loader_set_impl_library_name("libWPEBackend-default.so");
  }
  s_impl_loader = (wpe_loader_interface *)dlsym(s_impl_library,"_wpe_loader_interface");
  return;
}

Assistant:

void
load_impl_library()
{
#ifdef WPE_BACKEND
    s_impl_library = dlopen(WPE_BACKEND, RTLD_NOW);
    if (!s_impl_library) {
        fprintf(stderr, "wpe: could not load compile-time defined WPE_BACKEND: %s\n", dlerror());
        abort();
    }
#else
#ifndef NDEBUG
    // Get the impl library from an environment variable, if available.
    char* env_library_name = getenv("WPE_BACKEND_LIBRARY");
    if (env_library_name) {
        s_impl_library = dlopen(env_library_name, RTLD_NOW);
        if (!s_impl_library) {
            fprintf(stderr, "wpe: could not load specified WPE_BACKEND_LIBRARY: %s\n", dlerror());
            abort();
        }
        wpe_loader_set_impl_library_name(env_library_name);
    }
#endif
    if (!s_impl_library) {
        // Load libWPEBackend-default.so by ... default.
        s_impl_library = dlopen("libWPEBackend-default.so", RTLD_NOW);
        if (!s_impl_library) {
            fprintf(stderr, "wpe: could not load the impl library. Is there any backend installed?: %s\n", dlerror());
            abort();
        }
        wpe_loader_set_impl_library_name("libWPEBackend-default.so");
    }
#endif

    s_impl_loader = dlsym(s_impl_library, "_wpe_loader_interface");
}